

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

JavascriptFunction * __thiscall
Js::JavascriptLibrary::EnsureAsyncGeneratorThrowFunction(JavascriptLibrary *this)

{
  Type *addr;
  RuntimeFunction *pRVar1;
  
  addr = &this->asyncGeneratorThrowFunction;
  if ((this->asyncGeneratorThrowFunction).ptr == (JavascriptFunction *)0x0) {
    pRVar1 = DefaultCreateFunction
                       (this,(FunctionInfo *)JavascriptAsyncGenerator::EntryInfo::Throw,1,
                        (DynamicObject *)0x0,(DynamicType *)0x0,0x16a);
    Memory::Recycler::WBSetBit((char *)addr);
    (this->asyncGeneratorThrowFunction).ptr = &pRVar1->super_JavascriptFunction;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  return addr->ptr;
}

Assistant:

JavascriptFunction* JavascriptLibrary::EnsureAsyncGeneratorThrowFunction()
    {
        if (asyncGeneratorThrowFunction == nullptr)
        {
            asyncGeneratorThrowFunction = DefaultCreateFunction(&JavascriptAsyncGenerator::EntryInfo::Throw, 1, nullptr, nullptr, PropertyIds::throw_);
        }
        return asyncGeneratorThrowFunction;
    }